

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_strong_sensor_bc
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL strong_value,REF_DICT ref_dict_bcs)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_BOOL RVar5;
  long lVar6;
  int iVar7;
  REF_INT cell;
  REF_INT bc;
  REF_INT nodes [27];
  REF_INT local_c0;
  uint local_bc;
  REF_DBL local_b8;
  REF_GRID local_b0;
  REF_INT local_a8 [30];
  
  local_b8 = strong_value;
  if (ref_grid->twod == 0) {
    pRVar2 = ref_grid->cell[3];
    local_b0 = ref_grid;
    if (0 < pRVar2->max) {
      cell = 0;
      do {
        RVar3 = ref_cell_nodes(pRVar2,cell,local_a8);
        if (RVar3 == 0) {
          local_c0 = -1;
          uVar4 = ref_dict_value(ref_dict_bcs,local_a8[pRVar2->node_per],&local_c0);
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x547,"ref_phys_strong_sensor_bc",(ulong)uVar4,"bc");
            local_bc = uVar4;
          }
          if ((uVar4 != 5) && (uVar4 != 0)) {
            return local_bc;
          }
          RVar5 = ref_phys_wall_distance_bc(local_c0);
          if ((RVar5 != 0) && (iVar7 = pRVar2->node_per, 0 < (long)iVar7)) {
            lVar6 = 0;
            do {
              scalar[local_a8[lVar6]] = local_b8;
              lVar6 = lVar6 + 1;
            } while (iVar7 != lVar6);
          }
        }
        cell = cell + 1;
      } while (cell < pRVar2->max);
    }
    pRVar2 = local_b0->cell[6];
    if (0 < pRVar2->max) {
      iVar7 = 0;
      do {
        RVar3 = ref_cell_nodes(pRVar2,iVar7,local_a8);
        if (RVar3 == 0) {
          local_c0 = -1;
          uVar4 = ref_dict_value(ref_dict_bcs,local_a8[pRVar2->node_per],&local_c0);
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x552,"ref_phys_strong_sensor_bc",(ulong)uVar4,"bc");
            local_bc = uVar4;
          }
          if ((uVar4 != 5) && (uVar4 != 0)) {
            return local_bc;
          }
          RVar5 = ref_phys_wall_distance_bc(local_c0);
          if ((RVar5 != 0) && (iVar1 = pRVar2->node_per, 0 < (long)iVar1)) {
            lVar6 = 0;
            do {
              scalar[local_a8[lVar6]] = local_b8;
              lVar6 = lVar6 + 1;
            } while (iVar1 != lVar6);
          }
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < pRVar2->max);
    }
  }
  else {
    pRVar2 = ref_grid->cell[0];
    if (0 < pRVar2->max) {
      iVar7 = 0;
      do {
        RVar3 = ref_cell_nodes(pRVar2,iVar7,local_a8);
        if (RVar3 == 0) {
          local_c0 = -1;
          uVar4 = ref_dict_value(ref_dict_bcs,local_a8[pRVar2->node_per],&local_c0);
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x538,"ref_phys_strong_sensor_bc",(ulong)uVar4,"bc");
            local_bc = uVar4;
          }
          if ((uVar4 != 5) && (uVar4 != 0)) {
            return local_bc;
          }
          RVar5 = ref_phys_wall_distance_bc(local_c0);
          if ((RVar5 != 0) && (iVar1 = pRVar2->node_per, 0 < (long)iVar1)) {
            lVar6 = 0;
            do {
              scalar[local_a8[lVar6]] = local_b8;
              lVar6 = lVar6 + 1;
            } while (iVar1 != lVar6);
          }
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < pRVar2->max);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_strong_sensor_bc(REF_GRID ref_grid, REF_DBL *scalar,
                                             REF_DBL strong_value,
                                             REF_DICT ref_dict_bcs) {
  if (ref_grid_twod(ref_grid)) {
    REF_CELL ref_cell;
    REF_INT bc;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
    ref_cell = ref_grid_edg(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
  } else {
    REF_CELL ref_cell;
    REF_INT bc;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
  }
  return REF_SUCCESS;
}